

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O2

bool __thiscall InliningDecider::InlineIntoTopFunc(InliningDecider *this)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  
  if (this->jitMode != SimpleJit) {
    uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar2,LVar3);
    if (!bVar1) {
      uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,GlobOptPhase,uVar2,LVar3);
      if (!bVar1) {
        bVar1 = InlineIntoInliner(this,this->topFunc);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool InliningDecider::InlineIntoTopFunc() const
{
    if (this->jitMode == ExecutionMode::SimpleJit ||
        PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::GlobOptPhase, this->topFunc))
    {
        return false;
    }
#ifdef _M_IX86
    if (this->topFunc->GetHasTry())
    {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Has try\tCaller: %s (%s)\n"), this->topFunc->GetDisplayName(),
        this->topFunc->GetDebugNumberSet(debugStringBuffer));
        // Glob opt doesn't run on function with try, so we can't generate bailout for it
        return false;
    }
#endif

    return InlineIntoInliner(topFunc);
}